

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Performance::getShaderInfoLog_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,Functions *gl,deUint32 shader)

{
  code *pcVar1;
  int iVar2;
  reference pvVar3;
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> infoLogBuf;
  int infoLogLen;
  deUint32 shader_local;
  Functions *gl_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_40);
  (**(code **)(this + 0xa70))
            ((ulong)gl & 0xffffffff,0x8b84,
             &infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_40,
             (long)(infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1));
  pcVar1 = *(code **)(this + 0xa58);
  iVar2 = infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1;
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_40,0);
  (*pcVar1)((ulong)gl & 0xffffffff,iVar2,0,pvVar3);
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_40,0);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,pvVar3);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return __return_storage_ptr__;
}

Assistant:

static string getShaderInfoLog (const glw::Functions& gl, deUint32 shader)
{
	string			result;
	int				infoLogLen = 0;
	vector<char>	infoLogBuf;

	gl.getShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLogLen);
	infoLogBuf.resize(infoLogLen + 1);
	gl.getShaderInfoLog(shader, infoLogLen + 1, DE_NULL, &infoLogBuf[0]);
	result = &infoLogBuf[0];

	return result;
}